

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O1

void __thiscall Gluco::SimpSolver::garbageCollect(SimpSolver *this)

{
  uint *__ptr;
  ClauseAllocator to;
  RegionAllocator<unsigned_int> local_28;
  
  local_28.memory = (uint *)0x0;
  local_28.sz = 0;
  local_28.cap = 0;
  local_28.wasted_ = 0;
  RegionAllocator<unsigned_int>::capacity
            (&local_28,
             (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz -
             (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.wasted_);
  local_28._20_1_ = 0;
  cleanUpClauses(this);
  local_28._20_1_ = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14;
  relocAll(this,(ClauseAllocator *)&local_28);
  Solver::relocAll(&this->super_Solver,(ClauseAllocator *)&local_28);
  if (1 < (this->super_Solver).verbosity) {
    printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",
           (ulong)((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz << 2),
           (ulong)(local_28.sz << 2));
  }
  (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14 = local_28._20_1_;
  __ptr = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
  if (__ptr != (uint *)0x0) {
    free(__ptr);
  }
  (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory = local_28.memory;
  (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.sz = local_28.sz;
  (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.cap = local_28.cap;
  (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.wasted_ = local_28.wasted_;
  return;
}

Assistant:

void SimpSolver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted()); 

    cleanUpClauses();
    to.extra_clause_field = ca.extra_clause_field; // NOTE: this is important to keep (or lose) the extra fields.
    relocAll(to);
    Solver::relocAll(to);
    if (verbosity >= 2)
        printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n", 
               ca.size()*ClauseAllocator::Unit_Size, to.size()*ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}